

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

bool __thiscall p2t::Sweep::LargeHole_DontFill(Sweep *this,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  bool bVar3;
  Node *prev2Node;
  Node *next2Node;
  Node *prevNode;
  Node *nextNode;
  Node *node_local;
  Sweep *this_local;
  
  pNVar1 = node->next;
  pNVar2 = node->prev;
  bVar3 = AngleExceeds90Degrees(this,node->point,pNVar1->point,pNVar2->point);
  if (bVar3) {
    if ((pNVar1->next != (Node *)0x0) &&
       (bVar3 = AngleExceedsPlus90DegreesOrIsNegative
                          (this,node->point,pNVar1->next->point,pNVar2->point), !bVar3)) {
      return false;
    }
    if ((pNVar2->prev != (Node *)0x0) &&
       (bVar3 = AngleExceedsPlus90DegreesOrIsNegative
                          (this,node->point,pNVar1->point,pNVar2->prev->point), !bVar3)) {
      return false;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Sweep::LargeHole_DontFill(const Node* node) const {

  const Node* nextNode = node->next;
  const Node* prevNode = node->prev;
  if (!AngleExceeds90Degrees(node->point, nextNode->point, prevNode->point))
          return false;

  // Check additional points on front.
  const Node* next2Node = nextNode->next;
  // "..Plus.." because only want angles on same side as point being added.
  if ((next2Node != NULL) && !AngleExceedsPlus90DegreesOrIsNegative(node->point, next2Node->point, prevNode->point))
          return false;

  const Node* prev2Node = prevNode->prev;
  // "..Plus.." because only want angles on same side as point being added.
  if ((prev2Node != NULL) && !AngleExceedsPlus90DegreesOrIsNegative(node->point, nextNode->point, prev2Node->point))
          return false;

  return true;
}